

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddApa.c
# Opt level: O3

int Cudd_ApaCompare(int digitsFirst,DdApaNumber first,int digitsSecond,DdApaNumber second)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  
  uVar7 = 0;
  uVar8 = 0;
  if (0 < digitsFirst) {
    uVar8 = 0;
    do {
      if (first[uVar8] != 0) goto LAB_007c5241;
      uVar8 = uVar8 + 1;
    } while ((uint)digitsFirst != uVar8);
    uVar8 = (ulong)(uint)digitsFirst;
  }
LAB_007c5241:
  if (0 < digitsSecond) {
    uVar7 = 0;
    do {
      if (second[uVar7] != 0) goto LAB_007c525c;
      uVar7 = uVar7 + 1;
    } while ((uint)digitsSecond != uVar7);
    uVar7 = (ulong)(uint)digitsSecond;
  }
LAB_007c525c:
  uVar5 = digitsFirst - (int)uVar8;
  iVar4 = digitsSecond - (int)uVar7;
  iVar3 = 1;
  if ((int)uVar5 <= iVar4) {
    if (iVar4 <= (int)uVar5) {
      if (0 < (int)uVar5) {
        uVar6 = 0;
        do {
          uVar1 = second[(uVar7 & 0xffffffff) + uVar6];
          uVar2 = first[(uVar8 & 0xffffffff) + uVar6];
          if (uVar2 >= uVar1 && uVar2 != uVar1) {
            return 1;
          }
          if (uVar2 < uVar1) goto LAB_007c526d;
          uVar6 = uVar6 + 1;
        } while (uVar5 != uVar6);
      }
      return 0;
    }
LAB_007c526d:
    iVar3 = -1;
  }
  return iVar3;
}

Assistant:

int
Cudd_ApaCompare(
  int digitsFirst,
  DdApaNumber  first,
  int digitsSecond,
  DdApaNumber  second)
{
    int i;
    int firstNZ, secondNZ;

    /* Find first non-zero in both numbers. */
    for (firstNZ = 0; firstNZ < digitsFirst; firstNZ++)
        if (first[firstNZ] != 0) break;
    for (secondNZ = 0; secondNZ < digitsSecond; secondNZ++)
        if (second[secondNZ] != 0) break;
    if (digitsFirst - firstNZ > digitsSecond - secondNZ) return(1);
    else if (digitsFirst - firstNZ < digitsSecond - secondNZ) return(-1);
    for (i = 0; i < digitsFirst - firstNZ; i++) {
        if (first[firstNZ + i] > second[secondNZ + i]) return(1);
        else if (first[firstNZ + i] < second[secondNZ + i]) return(-1);
    }
    return(0);

}